

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void check_match(LexState *ls,int what,int who,int where)

{
  lua_State *L;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = testnext(ls,what);
  if (iVar1 != 0) {
    return;
  }
  if (ls->linenumber == where) {
    error_expected(ls,what);
  }
  L = ls->L;
  pcVar2 = luaX_token2str(ls,what);
  pcVar3 = luaX_token2str(ls,who);
  pcVar2 = luaO_pushfstring(L,"%s expected (to close %s at line %d)",pcVar2,pcVar3,
                            (ulong)(uint)where);
  luaX_syntaxerror(ls,pcVar2);
}

Assistant:

static void check_match (LexState *ls, int what, int who, int where) {
  if (!testnext(ls, what)) {
    if (where == ls->linenumber)
      error_expected(ls, what);
    else {
      luaX_syntaxerror(ls, luaO_pushfstring(ls->L,
             "%s expected (to close %s at line %d)",
              luaX_token2str(ls, what), luaX_token2str(ls, who), where));
    }
  }
}